

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImDrawList::AddLine(ImDrawList *this,ImVec2 *a,ImVec2 *b,ImU32 col,float thickness)

{
  ImVec2 *lhs;
  ImVec2 local_48;
  ImVec2 local_40;
  ImVec2 local_38;
  ImVec2 local_30;
  float local_28;
  ImU32 local_24;
  float thickness_local;
  ImU32 col_local;
  ImVec2 *b_local;
  ImVec2 *a_local;
  ImDrawList *this_local;
  
  if (col >> 0x18 != 0) {
    local_28 = thickness;
    local_24 = col;
    _thickness_local = b;
    b_local = a;
    a_local = (ImVec2 *)this;
    ImVec2::ImVec2(&local_38,0.5,0.5);
    local_30 = ::operator+(a,&local_38);
    PathLineTo(this,&local_30);
    lhs = _thickness_local;
    ImVec2::ImVec2(&local_48,0.5,0.5);
    local_40 = ::operator+(lhs,&local_48);
    PathLineTo(this,&local_40);
    PathStroke(this,local_24,false,local_28);
  }
  return;
}

Assistant:

void ImDrawList::AddLine(const ImVec2& a, const ImVec2& b, ImU32 col, float thickness)
{
    if ((col >> 24) == 0)
        return;
    PathLineTo(a + ImVec2(0.5f,0.5f));
    PathLineTo(b + ImVec2(0.5f,0.5f));
    PathStroke(col, false, thickness);
}